

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_controller.cpp
# Opt level: O2

void __thiscall so_5::stats::impl::std_controller_t::body(std_controller_t *this)

{
  long lVar1;
  duration dVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  duration<long,_std::ratio<1L,_1000000000L>_> local_40;
  unique_lock<std::mutex> local_38;
  
  while( true ) {
    std::unique_lock<std::mutex>::unique_lock(&local_38,&this->m_data_lock);
    if (this->m_shutdown_initiated != false) break;
    dVar2 = distribute_current_data(this);
    lVar1 = (this->m_distribution_period).__r;
    lVar3 = lVar1 - dVar2.__r;
    if (lVar3 != 0 && dVar2.__r <= lVar1) {
      local_40.__r = lVar3;
      std::condition_variable::wait_for<long,std::ratio<1l,1000000000l>>
                (&this->m_wake_up_cond,&local_38,&local_40);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_38);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  return;
}

Assistant:

void
std_controller_t::body()
	{
		while( true )
			{
				std::unique_lock< std::mutex > lock{ m_data_lock };

				if( m_shutdown_initiated )
					return;

				const auto actual_duration = distribute_current_data();

				if( actual_duration < m_distribution_period )
					// There is some time to sleep.
					m_wake_up_cond.wait_for(
							lock,
							m_distribution_period - actual_duration );
			}
	}